

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O0

bool __thiscall VanEmdeBoasTree::find(VanEmdeBoasTree *this,Node *root,int value)

{
  Node **ppNVar1;
  Node *root_00;
  int iVar2;
  int value_local;
  Node *root_local;
  VanEmdeBoasTree *this_local;
  
  if (root == (Node *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((value < 0) || (root->uni <= value)) {
    this_local._7_1_ = false;
  }
  else if ((value < root->min) || (root->max < value)) {
    this_local._7_1_ = false;
  }
  else if (root->min == value) {
    this_local._7_1_ = true;
  }
  else if (root->summary == (Node *)0x0) {
    this_local._7_1_ = root->max == value;
  }
  else {
    ppNVar1 = root->cluster;
    iVar2 = high(this,root,value);
    root_00 = ppNVar1[iVar2];
    iVar2 = low(this,root,value);
    this_local._7_1_ = find(this,root_00,iVar2);
  }
  return this_local._7_1_;
}

Assistant:

bool VanEmdeBoasTree::find(Node *root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }
    if (root->min == value) {
        return true;
    }
    if (!root->summary) {
        return root->max == value;
    }
    return find(root->cluster[high(root, value)], low(root, value));
}